

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O0

bool soul::AST::TypeMetaFunction::performBoolOp(Op op,Type *inputType)

{
  Type *inputType_local;
  Op op_local;
  
  switch(op) {
  case none:
  case sourceType:
  case makeConst:
  case makeReference:
  case removeReference:
  case elementType:
  case primitiveType:
  case size:
  default:
    throwInternalCompilerError("performBoolOp",0x782);
  case isStruct:
    inputType_local._7_1_ = Type::isStruct(inputType);
    break;
  case isArray:
    inputType_local._7_1_ = Type::isArray(inputType);
    break;
  case isDynamicArray:
    inputType_local._7_1_ = Type::isUnsizedArray(inputType);
    break;
  case isFixedSizeArray:
    inputType_local._7_1_ = Type::isFixedSizeArray(inputType);
    break;
  case isVector:
    inputType_local._7_1_ = Type::isVector(inputType);
    break;
  case isPrimitive:
    inputType_local._7_1_ = Type::isPrimitive(inputType);
    break;
  case isFloat:
    inputType_local._7_1_ = Type::isFloatingPoint(inputType);
    break;
  case isFloat32:
    inputType_local._7_1_ = Type::isFloat32(inputType);
    break;
  case isFloat64:
    inputType_local._7_1_ = Type::isFloat64(inputType);
    break;
  case isInt:
    inputType_local._7_1_ = Type::isInteger(inputType);
    break;
  case isInt32:
    inputType_local._7_1_ = Type::isInteger32(inputType);
    break;
  case isInt64:
    inputType_local._7_1_ = Type::isInteger64(inputType);
    break;
  case isScalar:
    inputType_local._7_1_ = Type::isScalar(inputType);
    break;
  case isString:
    inputType_local._7_1_ = Type::isStringLiteral(inputType);
    break;
  case isBool:
    inputType_local._7_1_ = Type::isBool(inputType);
    break;
  case isComplex:
    inputType_local._7_1_ = Type::isComplex(inputType);
    break;
  case isReference:
    inputType_local._7_1_ = Type::isReference(inputType);
    break;
  case isConst:
    inputType_local._7_1_ = Type::isConst(inputType);
  }
  return inputType_local._7_1_;
}

Assistant:

static bool performBoolOp (Op op, const Type& inputType)
        {
            switch (op)
            {
                case Op::isStruct:          return inputType.isStruct();
                case Op::isArray:           return inputType.isArray();
                case Op::isDynamicArray:    return inputType.isUnsizedArray();
                case Op::isFixedSizeArray:  return inputType.isFixedSizeArray();
                case Op::isVector:          return inputType.isVector();
                case Op::isPrimitive:       return inputType.isPrimitive();
                case Op::isFloat:           return inputType.isFloatingPoint();
                case Op::isFloat32:         return inputType.isFloat32();
                case Op::isFloat64:         return inputType.isFloat64();
                case Op::isInt:             return inputType.isInteger();
                case Op::isInt32:           return inputType.isInteger32();
                case Op::isInt64:           return inputType.isInteger64();
                case Op::isScalar:          return inputType.isScalar();
                case Op::isString:          return inputType.isStringLiteral();
                case Op::isBool:            return inputType.isBool();
                case Op::isComplex:         return inputType.isComplex();
                case Op::isReference:       return inputType.isReference();
                case Op::isConst:           return inputType.isConst();

                case Op::none:
                case Op::sourceType:
                case Op::makeConst:
                case Op::makeReference:
                case Op::removeReference:
                case Op::elementType:
                case Op::primitiveType:
                case Op::size:
                default:                    SOUL_ASSERT_FALSE; return false;
            }
        }